

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

Abc_Cex_t * Vta_ManRefineAbstraction(Vta_Man_t *p,int f)

{
  sat_solver2 *psVar1;
  Vec_Ptr_t *pVVar2;
  Vta_Man_t *pVVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vta_Obj_t *pVVar7;
  Vta_Obj_t *pVVar8;
  Gia_Obj_t *pObj_00;
  uint uVar9;
  bool bVar10;
  uint local_70;
  int local_6c;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Vta_Obj_t *pTop;
  Vta_Obj_t *pThis1;
  Vta_Obj_t *pThis0;
  Vta_Obj_t *pThis;
  Vec_Ptr_t *vTermsUnused;
  Vec_Ptr_t *vTermsUsed;
  Vec_Int_t *vTermsToAdd;
  Vec_Int_t *vOrder;
  Abc_Cex_t *pCex;
  int fVerify;
  int f_local;
  Vta_Man_t *p_local;
  
  pCex._0_4_ = 0;
  vOrder = (Vec_Int_t *)0x0;
  pCex._4_4_ = f;
  _fVerify = p;
  vTermsToAdd = Vta_ManCollectNodes(p,f);
  local_6c = 0;
  while( true ) {
    iVar4 = Vec_IntSize(vTermsToAdd);
    pVVar3 = _fVerify;
    bVar10 = false;
    if (local_6c < iVar4) {
      iVar4 = Vec_IntEntry(vTermsToAdd,local_6c);
      pThis0 = Vta_ManObj(pVVar3,iVar4);
      bVar10 = false;
      if (pThis0 != (Vta_Obj_t *)0x0) {
        _Counter = Gia_ManObj(_fVerify->pGia,pThis0->iObj);
        bVar10 = _Counter != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar10) break;
    *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xf0000000 | 0xfffffff;
    psVar1 = _fVerify->pSat;
    iVar4 = Vta_ObjId(_fVerify,pThis0);
    iVar6 = sat_solver2_var_value(psVar1,iVar4);
    iVar4 = 1;
    if (iVar6 != 0) {
      iVar4 = 2;
    }
    *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xcfffffff | iVar4 << 0x1c;
    *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0x7fffffff;
    local_6c = local_6c + 1;
  }
  if ((int)pCex != 0) {
    local_6c = 0;
    while( true ) {
      iVar4 = Vec_IntSize(vTermsToAdd);
      pVVar3 = _fVerify;
      bVar10 = false;
      if (local_6c < iVar4) {
        iVar4 = Vec_IntEntry(vTermsToAdd,local_6c);
        pThis0 = Vta_ManObj(pVVar3,iVar4);
        bVar10 = false;
        if (pThis0 != (Vta_Obj_t *)0x0) {
          _Counter = Gia_ManObj(_fVerify->pGia,pThis0->iObj);
          bVar10 = _Counter != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar10) break;
      if ((*(uint *)&pThis0->field_0xc >> 0x1e & 1) != 0) {
        Vta_ObjPreds(_fVerify,pThis0,_Counter,&pThis1,&pTop);
        iVar4 = Gia_ObjIsAnd(_Counter);
        pVVar7 = pThis1;
        if (iVar4 == 0) {
          iVar4 = Gia_ObjIsRo(_fVerify->pGia,_Counter);
          if (iVar4 != 0) {
            _Counter = Gia_ObjRoToRi(_fVerify->pGia,_Counter);
            pVVar7 = pThis1;
            if (pThis0->iFrame == 0) {
              if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 1) {
                __assert_fail("pThis->Value == VTA_VAR0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x26e,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
            }
            else if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) == 1) {
              iVar4 = Gia_ObjFaninC0(_Counter);
              iVar4 = Vta_ValIs0(pVVar7,iVar4);
              if (iVar4 == 0) {
                __assert_fail("Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x270,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
            }
            else {
              if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 2) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x273,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              iVar4 = Gia_ObjFaninC0(_Counter);
              iVar4 = Vta_ValIs1(pVVar7,iVar4);
              if (iVar4 == 0) {
                __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x272,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
            }
          }
        }
        else if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) == 2) {
          iVar4 = Gia_ObjFaninC0(_Counter);
          iVar4 = Vta_ValIs1(pVVar7,iVar4);
          pVVar7 = pTop;
          if (iVar4 == 0) {
LAB_007b3dcd:
            __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x265,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          iVar4 = Gia_ObjFaninC1(_Counter);
          iVar4 = Vta_ValIs1(pVVar7,iVar4);
          if (iVar4 == 0) goto LAB_007b3dcd;
        }
        else {
          if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x268,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          iVar4 = Gia_ObjFaninC0(_Counter);
          iVar4 = Vta_ValIs0(pVVar7,iVar4);
          pVVar7 = pTop;
          if (iVar4 == 0) {
            iVar4 = Gia_ObjFaninC1(_Counter);
            iVar4 = Vta_ValIs0(pVVar7,iVar4);
            if (iVar4 == 0) {
              __assert_fail("Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x267,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
          }
        }
      }
      local_6c = local_6c + 1;
    }
  }
  pVVar3 = _fVerify;
  iVar4 = Vec_IntEntryLast(vTermsToAdd);
  pThis0 = Vta_ManObj(pVVar3,iVar4);
  *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xf0000000 | 1;
  vTermsUnused = Vec_PtrAlloc(0x3f7);
  pThis = (Vta_Obj_t *)Vec_PtrAlloc(0x3f8);
  local_6c = Vec_IntSize(vTermsToAdd);
  while( true ) {
    pVVar3 = _fVerify;
    local_6c = local_6c + -1;
    bVar10 = false;
    if (-1 < local_6c) {
      iVar4 = Vec_IntEntry(vTermsToAdd,local_6c);
      pThis0 = Vta_ManObj(pVVar3,iVar4);
      bVar10 = false;
      if (pThis0 != (Vta_Obj_t *)0x0) {
        _Counter = Gia_ManObj(_fVerify->pGia,pThis0->iObj);
        bVar10 = _Counter != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar10) break;
    if (0xffffffe < (*(uint *)&pThis0->field_0xc & 0xfffffff)) {
      __assert_fail("pThis->Prio < VTA_LARGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x280,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
    iVar4 = Gia_ObjIsConst0(_Counter);
    if ((iVar4 == 0) && (iVar4 = Gia_ObjIsPi(_fVerify->pGia,_Counter), iVar4 == 0)) {
      iVar4 = Gia_ObjIsAnd(_Counter);
      if ((iVar4 == 0) && (iVar4 = Gia_ObjIsRo(_fVerify->pGia,_Counter), iVar4 == 0)) {
        __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x288,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      if ((*(uint *)&pThis0->field_0xc >> 0x1e & 1) == 0) {
        if ((*(uint *)&pThis0->field_0xc & 0xfffffff) == 0) {
          __assert_fail("pThis->Prio > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x28b,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        iVar4 = Vta_ManObjIsUsed(_fVerify,pThis0->iObj);
        if (iVar4 == 0) {
          Vec_PtrPush((Vec_Ptr_t *)pThis,pThis0);
        }
        else {
          Vec_PtrPush(vTermsUnused,pThis0);
        }
      }
      else {
        Vta_ObjPreds(_fVerify,pThis0,_Counter,&pThis1,&pTop);
        if (pThis1 != (Vta_Obj_t *)0x0) {
          uVar5 = Abc_MinInt(*(uint *)&pThis1->field_0xc & 0xfffffff,
                             (*(uint *)&pThis0->field_0xc & 0xfffffff) + 1);
          *(uint *)&pThis1->field_0xc = *(uint *)&pThis1->field_0xc & 0xf0000000 | uVar5 & 0xfffffff
          ;
        }
        if (pTop != (Vta_Obj_t *)0x0) {
          uVar5 = Abc_MinInt(*(uint *)&pTop->field_0xc & 0xfffffff,
                             (*(uint *)&pThis0->field_0xc & 0xfffffff) + 1);
          *(uint *)&pTop->field_0xc = *(uint *)&pTop->field_0xc & 0xf0000000 | uVar5 & 0xfffffff;
        }
      }
    }
    else {
      *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xf0000000;
    }
  }
  for (local_6c = 0; iVar4 = Vec_PtrSize(vTermsUnused), local_6c < iVar4; local_6c = local_6c + 1) {
    pThis0 = (Vta_Obj_t *)Vec_PtrEntry(vTermsUnused,local_6c);
    *(uint *)&pThis0->field_0xc =
         *(uint *)&pThis0->field_0xc & 0xf0000000 | pThis0->iObj & 0xfffffffU;
  }
  for (local_6c = 0; iVar4 = Vec_PtrSize((Vec_Ptr_t *)pThis), local_6c < iVar4;
      local_6c = local_6c + 1) {
    pThis0 = (Vta_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pThis,local_6c);
    *(uint *)&pThis0->field_0xc =
         *(uint *)&pThis0->field_0xc & 0xf0000000 | pThis0->iObj & 0xfffffffU;
  }
  Vec_PtrSort(vTermsUnused,Vta_ManComputeDepthIncrease);
  Vec_PtrSort((Vec_Ptr_t *)pThis,Vta_ManComputeDepthIncrease);
  iVar4 = Vec_PtrSize(vTermsUnused);
  if (1 < iVar4) {
    pThis1 = (Vta_Obj_t *)Vec_PtrEntry(vTermsUnused,0);
    pTop = (Vta_Obj_t *)Vec_PtrEntryLast(vTermsUnused);
    if ((*(uint *)&pTop->field_0xc & 0xfffffff) < (*(uint *)&pThis1->field_0xc & 0xfffffff)) {
      __assert_fail("pThis0->Prio <= pThis1->Prio",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x2ca,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
  }
  local_70 = 1;
  for (local_6c = 0; iVar4 = Vec_PtrSize(vTermsUnused), local_6c < iVar4; local_6c = local_6c + 1) {
    pThis0 = (Vta_Obj_t *)Vec_PtrEntry(vTermsUnused,local_6c);
    *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xf0000000 | local_70 & 0xfffffff;
    local_70 = local_70 + 1;
  }
  for (local_6c = 0; iVar4 = Vec_PtrSize((Vec_Ptr_t *)pThis), local_6c < iVar4;
      local_6c = local_6c + 1) {
    pThis0 = (Vta_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pThis,local_6c);
    *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xf0000000 | local_70 & 0xfffffff;
    local_70 = local_70 + 1;
  }
  local_6c = 0;
  while( true ) {
    iVar4 = Vec_IntSize(vTermsToAdd);
    pVVar3 = _fVerify;
    bVar10 = false;
    if (local_6c < iVar4) {
      iVar4 = Vec_IntEntry(vTermsToAdd,local_6c);
      pThis0 = Vta_ManObj(pVVar3,iVar4);
      bVar10 = false;
      if (pThis0 != (Vta_Obj_t *)0x0) {
        _Counter = Gia_ManObj(_fVerify->pGia,pThis0->iObj);
        bVar10 = _Counter != (Gia_Obj_t *)0x0;
      }
    }
    pVVar3 = _fVerify;
    if (!bVar10) break;
    if (*(int *)&pThis0->field_0xc < 0) {
      __assert_fail("pThis->fVisit == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x2d8,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
    if (0xffffffe < (*(uint *)&pThis0->field_0xc & 0xfffffff)) {
      __assert_fail("pThis->Prio < VTA_LARGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x2d9,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
    if ((*(uint *)&pThis0->field_0xc >> 0x1e & 1) != 0) {
      if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) == 0) {
        __assert_fail("pThis->Value != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x2de,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      iVar4 = Gia_ObjIsAnd(_Counter);
      pVVar3 = _fVerify;
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsRo(_fVerify->pGia,_Counter);
        if (iVar4 == 0) {
          iVar4 = Gia_ObjIsConst0(_Counter);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x305,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xf0000000;
        }
        else if (pThis0->iFrame < 1) {
          *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xf0000000;
        }
        else {
          _Counter = Gia_ObjRoToRi(_fVerify->pGia,_Counter);
          pVVar3 = _fVerify;
          iVar4 = Gia_ObjFaninId0p(_fVerify->pGia,_Counter);
          pThis1 = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame + -1);
          if (pThis1 == (Vta_Obj_t *)0x0) {
            __assert_fail("pThis0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x2fc,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          *(uint *)&pThis0->field_0xc =
               *(uint *)&pThis0->field_0xc & 0xf0000000 | *(uint *)&pThis1->field_0xc & 0xfffffff;
        }
      }
      else {
        iVar4 = Gia_ObjFaninId0p(_fVerify->pGia,_Counter);
        pThis1 = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame);
        pVVar3 = _fVerify;
        iVar4 = Gia_ObjFaninId1p(_fVerify->pGia,_Counter);
        pTop = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame);
        pVVar7 = pThis1;
        if ((pThis1 == (Vta_Obj_t *)0x0) || (pTop == (Vta_Obj_t *)0x0)) {
          __assert_fail("pThis0 && pThis1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x2e4,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) == 2) {
          iVar4 = Gia_ObjFaninC0(_Counter);
          iVar4 = Vta_ValIs1(pVVar7,iVar4);
          pVVar7 = pTop;
          if (iVar4 == 0) {
LAB_007b478c:
            __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x2e7,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          iVar4 = Gia_ObjFaninC1(_Counter);
          iVar4 = Vta_ValIs1(pVVar7,iVar4);
          if (iVar4 == 0) goto LAB_007b478c;
          uVar5 = Abc_MaxInt(*(uint *)&pThis1->field_0xc & 0xfffffff,
                             *(uint *)&pTop->field_0xc & 0xfffffff);
          *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xf0000000 | uVar5 & 0xfffffff
          ;
        }
        else {
          if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x2f4,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          iVar4 = Gia_ObjFaninC0(_Counter);
          iVar4 = Vta_ValIs0(pVVar7,iVar4);
          pVVar7 = pTop;
          if (iVar4 != 0) {
            iVar4 = Gia_ObjFaninC1(_Counter);
            iVar4 = Vta_ValIs0(pVVar7,iVar4);
            if (iVar4 != 0) {
              uVar5 = Abc_MinInt(*(uint *)&pThis1->field_0xc & 0xfffffff,
                                 *(uint *)&pTop->field_0xc & 0xfffffff);
              *(uint *)&pThis0->field_0xc =
                   *(uint *)&pThis0->field_0xc & 0xf0000000 | uVar5 & 0xfffffff;
              goto LAB_007b4a90;
            }
          }
          pVVar7 = pThis1;
          iVar4 = Gia_ObjFaninC0(_Counter);
          iVar4 = Vta_ValIs0(pVVar7,iVar4);
          pVVar7 = pTop;
          if (iVar4 == 0) {
            iVar4 = Gia_ObjFaninC1(_Counter);
            iVar4 = Vta_ValIs0(pVVar7,iVar4);
            if (iVar4 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x2f2,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            *(uint *)&pThis0->field_0xc =
                 *(uint *)&pThis0->field_0xc & 0xf0000000 | *(uint *)&pTop->field_0xc & 0xfffffff;
          }
          else {
            *(uint *)&pThis0->field_0xc =
                 *(uint *)&pThis0->field_0xc & 0xf0000000 | *(uint *)&pThis1->field_0xc & 0xfffffff;
          }
        }
      }
    }
LAB_007b4a90:
    local_6c = local_6c + 1;
  }
  iVar4 = Vec_IntEntryLast(vTermsToAdd);
  pVVar7 = Vta_ManObj(pVVar3,iVar4);
  *(uint *)&pVVar7->field_0xc = *(uint *)&pVVar7->field_0xc & 0x7fffffff | 0x80000000;
  vTermsUsed = (Vec_Ptr_t *)Vec_IntAlloc(100);
  local_6c = Vec_IntSize(vTermsToAdd);
LAB_007b4af7:
  do {
    do {
      pVVar3 = _fVerify;
      local_6c = local_6c + -1;
      bVar10 = false;
      if (-1 < local_6c) {
        iVar4 = Vec_IntEntry(vTermsToAdd,local_6c);
        pThis0 = Vta_ManObj(pVVar3,iVar4);
        bVar10 = false;
        if (pThis0 != (Vta_Obj_t *)0x0) {
          _Counter = Gia_ManObj(_fVerify->pGia,pThis0->iObj);
          bVar10 = _Counter != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar10) {
        if (_fVerify->pPars->fAddLayer != 0) {
          local_6c = 0;
          while( true ) {
            iVar4 = Vec_IntSize((Vec_Int_t *)vTermsUsed);
            pVVar3 = _fVerify;
            bVar10 = false;
            if (local_6c < iVar4) {
              iVar4 = Vec_IntEntry((Vec_Int_t *)vTermsUsed,local_6c);
              pThis0 = Vta_ManObj(pVVar3,iVar4);
              bVar10 = pThis0 != (Vta_Obj_t *)0x0;
            }
            if (!bVar10) break;
            if (*(int *)&pThis0->field_0xc < 0) {
              __assert_fail("pThis->fVisit == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x360,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0x7fffffff | 0x80000000;
            local_6c = local_6c + 1;
          }
          Vec_IntSize((Vec_Int_t *)vTermsUsed);
          for (local_6c = 0; iVar4 = Vec_PtrSize(vTermsUnused), local_6c < iVar4;
              local_6c = local_6c + 1) {
            pThis0 = (Vta_Obj_t *)Vec_PtrEntry(vTermsUnused,local_6c);
            pVVar2 = vTermsUsed;
            if (-1 < *(int *)&pThis0->field_0xc) {
              iVar4 = Vta_ObjId(_fVerify,pThis0);
              Vec_IntPush((Vec_Int_t *)pVVar2,iVar4);
            }
          }
          local_6c = 0;
          while( true ) {
            iVar4 = Vec_IntSize((Vec_Int_t *)vTermsUsed);
            pVVar3 = _fVerify;
            bVar10 = false;
            if (local_6c < iVar4) {
              iVar4 = Vec_IntEntry((Vec_Int_t *)vTermsUsed,local_6c);
              pThis0 = Vta_ManObj(pVVar3,iVar4);
              bVar10 = pThis0 != (Vta_Obj_t *)0x0;
            }
            if (!bVar10) break;
            *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0x7fffffff;
            local_6c = local_6c + 1;
          }
        }
        Vec_PtrFree(vTermsUnused);
        Vec_PtrFree((Vec_Ptr_t *)pThis);
        if ((int)pCex == 0) {
LAB_007b5b27:
          if ((*(uint *)&pVVar7->field_0xc & 0xfffffff) == 0) {
            vOrder = (Vec_Int_t *)Vga_ManDeriveCex(_fVerify);
          }
          else {
            local_6c = 0;
            while( true ) {
              iVar4 = Vec_IntSize((Vec_Int_t *)vTermsUsed);
              pVVar3 = _fVerify;
              bVar10 = false;
              if (local_6c < iVar4) {
                iVar4 = Vec_IntEntry((Vec_Int_t *)vTermsUsed,local_6c);
                pThis0 = Vta_ManObj(pVVar3,iVar4);
                bVar10 = false;
                if (pThis0 != (Vta_Obj_t *)0x0) {
                  _Counter = Gia_ManObj(_fVerify->pGia,pThis0->iObj);
                  bVar10 = _Counter != (Gia_Obj_t *)0x0;
                }
              }
              if (!bVar10) break;
              iVar4 = Gia_ObjIsPi(_fVerify->pGia,_Counter);
              if (iVar4 == 0) {
                Vga_ManAddClausesOne(_fVerify,pThis0->iObj,pThis0->iFrame);
              }
              local_6c = local_6c + 1;
            }
            sat_solver2_simplify(_fVerify->pSat);
          }
          iVar4 = Vec_IntSize((Vec_Int_t *)vTermsUsed);
          _fVerify->nObjAdded = iVar4 + _fVerify->nObjAdded;
          Vec_IntFree((Vec_Int_t *)vTermsUsed);
          return (Abc_Cex_t *)vOrder;
        }
        local_6c = 0;
        while( true ) {
          iVar4 = Vec_IntSize(vTermsToAdd);
          pVVar3 = _fVerify;
          bVar10 = false;
          if (local_6c < iVar4) {
            iVar4 = Vec_IntEntry(vTermsToAdd,local_6c);
            pThis0 = Vta_ManObj(pVVar3,iVar4);
            bVar10 = pThis0 != (Vta_Obj_t *)0x0;
          }
          if (!bVar10) break;
          *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x30000000;
          local_6c = local_6c + 1;
        }
        local_6c = 0;
        while( true ) {
          iVar4 = Vec_IntSize((Vec_Int_t *)vTermsUsed);
          pVVar3 = _fVerify;
          bVar10 = false;
          if (local_6c < iVar4) {
            iVar4 = Vec_IntEntry((Vec_Int_t *)vTermsUsed,local_6c);
            pThis0 = Vta_ManObj(pVVar3,iVar4);
            bVar10 = pThis0 != (Vta_Obj_t *)0x0;
          }
          if (!bVar10) break;
          if ((*(uint *)&pThis0->field_0xc >> 0x1e & 1) != 0) {
            __assert_fail("!pThis->fAdded",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x382,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          psVar1 = _fVerify->pSat;
          iVar4 = Vta_ObjId(_fVerify,pThis0);
          iVar6 = sat_solver2_var_value(psVar1,iVar4);
          iVar4 = 1;
          if (iVar6 != 0) {
            iVar4 = 2;
          }
          *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xcfffffff | iVar4 << 0x1c;
          local_6c = local_6c + 1;
        }
        local_6c = 0;
        do {
          iVar4 = Vec_IntSize(vTermsToAdd);
          pVVar3 = _fVerify;
          bVar10 = false;
          if (local_6c < iVar4) {
            iVar4 = Vec_IntEntry(vTermsToAdd,local_6c);
            pThis0 = Vta_ManObj(pVVar3,iVar4);
            bVar10 = false;
            if (pThis0 != (Vta_Obj_t *)0x0) {
              _Counter = Gia_ManObj(_fVerify->pGia,pThis0->iObj);
              bVar10 = _Counter != (Gia_Obj_t *)0x0;
            }
          }
          if (!bVar10) {
            pObj_00 = Gia_ManPo(_fVerify->pGia,0);
            iVar4 = Gia_ObjFaninC0(pObj_00);
            iVar4 = Vta_ValIs1(pVVar7,iVar4);
            if (iVar4 == 0) {
              Abc_Print(1,"Vta_ManRefineAbstraction(): Terminary simulation verification failed!\n")
              ;
            }
            goto LAB_007b5b27;
          }
          if (*(int *)&pThis0->field_0xc < 0) {
            __assert_fail("pThis->fVisit == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x388,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
          }
          if ((*(uint *)&pThis0->field_0xc >> 0x1e & 1) != 0) {
            iVar4 = Gia_ObjIsAnd(_Counter);
            pVVar3 = _fVerify;
            if (iVar4 == 0) {
              iVar4 = Gia_ObjIsRo(_fVerify->pGia,_Counter);
              if (iVar4 == 0) {
                iVar4 = Gia_ObjIsConst0(_Counter);
                if (iVar4 == 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                ,0x3ae,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x10000000;
              }
              else if (pThis0->iFrame < 1) {
                *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x10000000;
              }
              else {
                _Counter = Gia_ObjRoToRi(_fVerify->pGia,_Counter);
                pVVar3 = _fVerify;
                iVar4 = Gia_ObjFaninId0p(_fVerify->pGia,_Counter);
                pVVar8 = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame + -1);
                pThis1 = pVVar8;
                if (pVVar8 == (Vta_Obj_t *)0x0) {
                  __assert_fail("pThis0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                                ,0x39d,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
                }
                iVar4 = Gia_ObjFaninC0(_Counter);
                iVar4 = Vta_ValIs0(pVVar8,iVar4);
                pVVar8 = pThis1;
                if (iVar4 == 0) {
                  iVar4 = Gia_ObjFaninC0(_Counter);
                  iVar4 = Vta_ValIs1(pVVar8,iVar4);
                  if (iVar4 == 0) {
                    *(uint *)&pThis0->field_0xc =
                         *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x30000000;
                  }
                  else {
                    *(uint *)&pThis0->field_0xc =
                         *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x20000000;
                  }
                }
                else {
                  *(uint *)&pThis0->field_0xc =
                       *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x10000000;
                }
              }
            }
            else {
              iVar4 = Gia_ObjFaninId0p(_fVerify->pGia,_Counter);
              pThis1 = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame);
              pVVar3 = _fVerify;
              iVar4 = Gia_ObjFaninId1p(_fVerify->pGia,_Counter);
              pTop = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame);
              pVVar8 = pThis1;
              if ((pThis1 == (Vta_Obj_t *)0x0) || (pTop == (Vta_Obj_t *)0x0)) {
                __assert_fail("pThis0 && pThis1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x38f,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
              iVar4 = Gia_ObjFaninC0(_Counter);
              iVar4 = Vta_ValIs1(pVVar8,iVar4);
              pVVar8 = pTop;
              if (iVar4 != 0) {
                iVar4 = Gia_ObjFaninC1(_Counter);
                iVar4 = Vta_ValIs1(pVVar8,iVar4);
                if (iVar4 != 0) {
                  *(uint *)&pThis0->field_0xc =
                       *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x20000000;
                  goto LAB_007b5a42;
                }
              }
              pVVar8 = pThis1;
              iVar4 = Gia_ObjFaninC0(_Counter);
              iVar4 = Vta_ValIs0(pVVar8,iVar4);
              pVVar8 = pTop;
              if (iVar4 == 0) {
                iVar4 = Gia_ObjFaninC1(_Counter);
                iVar4 = Vta_ValIs0(pVVar8,iVar4);
                if (iVar4 == 0) {
                  *(uint *)&pThis0->field_0xc =
                       *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x30000000;
                  goto LAB_007b5a42;
                }
              }
              *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0xcfffffff | 0x10000000;
            }
LAB_007b5a42:
            if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 3) {
              uVar5 = *(uint *)&pThis0->field_0xc;
              psVar1 = _fVerify->pSat;
              iVar4 = Vta_ObjId(_fVerify,pThis0);
              iVar4 = sat_solver2_var_value(psVar1,iVar4);
              uVar9 = 1;
              if (iVar4 != 0) {
                uVar9 = 2;
              }
              if ((uVar5 >> 0x1c & 3) != uVar9) {
                __assert_fail("pThis->Value == VTA_VARX || (int)pThis->Value == (sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x3b0,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
            }
          }
          local_6c = local_6c + 1;
        } while( true );
      }
    } while (-1 < *(int *)&pThis0->field_0xc);
    *(uint *)&pThis0->field_0xc = *(uint *)&pThis0->field_0xc & 0x7fffffff;
    if ((*(uint *)&pVVar7->field_0xc & 0xfffffff) < (*(uint *)&pThis0->field_0xc & 0xfffffff)) {
      __assert_fail("pThis->Prio >= 0 && pThis->Prio <= pTop->Prio",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x311,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
    if ((*(uint *)&pThis0->field_0xc >> 0x1e & 1) == 0) {
      iVar4 = Gia_ObjIsAnd(_Counter);
      if ((((iVar4 == 0) && (iVar4 = Gia_ObjIsRo(_fVerify->pGia,_Counter), iVar4 == 0)) &&
          (iVar4 = Gia_ObjIsConst0(_Counter), iVar4 == 0)) &&
         (iVar4 = Gia_ObjIsPi(_fVerify->pGia,_Counter), iVar4 == 0)) {
        __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x315,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      pVVar2 = vTermsUsed;
      iVar4 = Vta_ObjId(_fVerify,pThis0);
      Vec_IntPush((Vec_Int_t *)pVVar2,iVar4);
      goto LAB_007b4af7;
    }
    if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) == 0) {
      __assert_fail("pThis->Value != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                    ,0x31a,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
    }
    iVar4 = Gia_ObjIsAnd(_Counter);
    pVVar3 = _fVerify;
    if (iVar4 != 0) {
      iVar4 = Gia_ObjFaninId0p(_fVerify->pGia,_Counter);
      pThis1 = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame);
      pVVar3 = _fVerify;
      iVar4 = Gia_ObjFaninId1p(_fVerify->pGia,_Counter);
      pTop = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame);
      pVVar8 = pThis1;
      if ((pThis1 == (Vta_Obj_t *)0x0) || (pTop == (Vta_Obj_t *)0x0)) {
        __assert_fail("pThis0 && pThis1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,800,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) == 2) {
        iVar4 = Gia_ObjFaninC0(_Counter);
        iVar4 = Vta_ValIs1(pVVar8,iVar4);
        pVVar8 = pTop;
        if (iVar4 != 0) {
          iVar4 = Gia_ObjFaninC1(_Counter);
          iVar4 = Vta_ValIs1(pVVar8,iVar4);
          if (iVar4 != 0) {
            if ((*(uint *)&pThis0->field_0xc & 0xfffffff) <
                (*(uint *)&pThis1->field_0xc & 0xfffffff)) {
              __assert_fail("pThis0->Prio <= pThis->Prio",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x324,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            if ((*(uint *)&pThis0->field_0xc & 0xfffffff) < (*(uint *)&pTop->field_0xc & 0xfffffff))
            {
              __assert_fail("pThis1->Prio <= pThis->Prio",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                            ,0x325,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
            }
            *(uint *)&pThis1->field_0xc = *(uint *)&pThis1->field_0xc & 0x7fffffff | 0x80000000;
            *(uint *)&pTop->field_0xc = *(uint *)&pTop->field_0xc & 0x7fffffff | 0x80000000;
            goto LAB_007b4af7;
          }
        }
        __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x323,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      if ((*(uint *)&pThis0->field_0xc >> 0x1c & 3) != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x34a,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      iVar4 = Gia_ObjFaninC0(_Counter);
      iVar4 = Vta_ValIs0(pVVar8,iVar4);
      pVVar8 = pTop;
      if (iVar4 != 0) {
        iVar4 = Gia_ObjFaninC1(_Counter);
        iVar4 = Vta_ValIs0(pVVar8,iVar4);
        if (iVar4 != 0) {
          if ((-1 < *(int *)&pThis1->field_0xc) && (-1 < *(int *)&pTop->field_0xc)) {
            if ((*(uint *)&pTop->field_0xc & 0xfffffff) < (*(uint *)&pThis1->field_0xc & 0xfffffff))
            {
              *(uint *)&pTop->field_0xc = *(uint *)&pTop->field_0xc & 0x7fffffff | 0x80000000;
              if ((*(uint *)&pTop->field_0xc & 0xfffffff) !=
                  (*(uint *)&pThis0->field_0xc & 0xfffffff)) {
                __assert_fail("pThis1->Prio == pThis->Prio",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x33b,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
            }
            else {
              *(uint *)&pThis1->field_0xc = *(uint *)&pThis1->field_0xc & 0x7fffffff | 0x80000000;
              if ((*(uint *)&pThis1->field_0xc & 0xfffffff) !=
                  (*(uint *)&pThis0->field_0xc & 0xfffffff)) {
                __assert_fail("pThis0->Prio == pThis->Prio",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                              ,0x336,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
              }
            }
          }
          goto LAB_007b4af7;
        }
      }
      pVVar8 = pThis1;
      iVar4 = Gia_ObjFaninC0(_Counter);
      iVar4 = Vta_ValIs0(pVVar8,iVar4);
      pVVar8 = pTop;
      if (iVar4 == 0) {
        iVar4 = Gia_ObjFaninC1(_Counter);
        iVar4 = Vta_ValIs0(pVVar8,iVar4);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x348,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
        *(uint *)&pTop->field_0xc = *(uint *)&pTop->field_0xc & 0x7fffffff | 0x80000000;
        if ((*(uint *)&pTop->field_0xc & 0xfffffff) != (*(uint *)&pThis0->field_0xc & 0xfffffff)) {
          __assert_fail("pThis1->Prio == pThis->Prio",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x346,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
      }
      else {
        *(uint *)&pThis1->field_0xc = *(uint *)&pThis1->field_0xc & 0x7fffffff | 0x80000000;
        if ((*(uint *)&pThis1->field_0xc & 0xfffffff) != (*(uint *)&pThis0->field_0xc & 0xfffffff))
        {
          __assert_fail("pThis0->Prio == pThis->Prio",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x341,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
        }
      }
      goto LAB_007b4af7;
    }
    iVar4 = Gia_ObjIsRo(_fVerify->pGia,_Counter);
    if (iVar4 == 0) {
      iVar4 = Gia_ObjIsConst0(_Counter);
      if (iVar4 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x358,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
    }
    else if (0 < pThis0->iFrame) {
      _Counter = Gia_ObjRoToRi(_fVerify->pGia,_Counter);
      pVVar3 = _fVerify;
      iVar4 = Gia_ObjFaninId0p(_fVerify->pGia,_Counter);
      pThis1 = Vga_ManFind(pVVar3,iVar4,pThis0->iFrame + -1);
      if (pThis1 == (Vta_Obj_t *)0x0) {
        __assert_fail("pThis0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x352,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
      *(uint *)&pThis1->field_0xc = *(uint *)&pThis1->field_0xc & 0x7fffffff | 0x80000000;
      if ((*(uint *)&pThis1->field_0xc & 0xfffffff) != (*(uint *)&pThis0->field_0xc & 0xfffffff)) {
        __assert_fail("pThis0->Prio == pThis->Prio",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                      ,0x354,"Abc_Cex_t *Vta_ManRefineAbstraction(Vta_Man_t *, int)");
      }
    }
  } while( true );
}

Assistant:

Abc_Cex_t * Vta_ManRefineAbstraction( Vta_Man_t * p, int f )
{
    int fVerify = 0;
    Abc_Cex_t * pCex = NULL;
    Vec_Int_t * vOrder, * vTermsToAdd;
    Vec_Ptr_t * vTermsUsed, * vTermsUnused;
    Vta_Obj_t * pThis, * pThis0, * pThis1, * pTop;
    Gia_Obj_t * pObj;
    int i, Counter;

    if ( fVerify )
    Vta_ManSatVerify( p );

    // collect nodes in a topological order
    vOrder = Vta_ManCollectNodes( p, f );
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        pThis->Prio = VTA_LARGE;
        pThis->Value = sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0;
        pThis->fVisit = 0;
    }

    // verify
    if ( fVerify )
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        if ( !pThis->fAdded )
            continue;
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) );
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            if ( pThis->iFrame == 0 )
                assert( pThis->Value == VTA_VAR0 );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) );
            else if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) );
            else assert( 0 );
        }
    }

    // compute distance in reverse order
    pThis = Vta_ManObj( p, Vec_IntEntryLast(vOrder) );
    pThis->Prio  = 1;
    // collect used and unused terms
    vTermsUsed   = Vec_PtrAlloc( 1015 );
    vTermsUnused = Vec_PtrAlloc( 1016 );
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
    {
        // there is no unreachable states
        assert( pThis->Prio < VTA_LARGE );
        // skip constants and PIs
        if ( Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) )
        {
            pThis->Prio = 0; // set highest priority
            continue;
        }
        // collect terminals
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) );
        if ( !pThis->fAdded )
        {
            assert( pThis->Prio > 0 );
            if ( Vta_ManObjIsUsed(p, pThis->iObj) )
                Vec_PtrPush( vTermsUsed, pThis );
            else
                Vec_PtrPush( vTermsUnused, pThis );
            continue;
        }
        // propagate
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( pThis0 ) 
            pThis0->Prio = Abc_MinInt( pThis0->Prio, pThis->Prio + 1 );
        if ( pThis1 ) 
            pThis1->Prio = Abc_MinInt( pThis1->Prio, pThis->Prio + 1 );
    }

/*
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
        if ( pThis->Prio > 0 )
            pThis->Prio = 10;
*/
/*
    // update priorities according to reconvergence counters
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
    {
        Vta_Obj_t * pThis0, * pThis1;
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, pThis->iObj );
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        pThis->Prio += 10000000;
        if ( pThis0 )
            pThis->Prio -= 1000000 * pThis0->fAdded;
        if ( pThis1 )
            pThis->Prio -= 1000000 * pThis1->fAdded;
    }
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
    {
        Vta_Obj_t * pThis0, * pThis1;
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, pThis->iObj );
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        pThis->Prio += 10000000;
        if ( pThis0 )
            pThis->Prio -= 1000000 * pThis0->fAdded;
        if ( pThis1 )
            pThis->Prio -= 1000000 * pThis1->fAdded;
    }
*/


    // update priorities according to reconvergence counters
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        pThis->Prio = pThis->iObj;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
        pThis->Prio = pThis->iObj;


    // objects with equal distance should receive priority based on number
    // those objects whose prototypes have been added in other timeframes
    // should have higher priority than the current object
    Vec_PtrSort( vTermsUsed,   (int (*)(void))Vta_ManComputeDepthIncrease );
    Vec_PtrSort( vTermsUnused, (int (*)(void))Vta_ManComputeDepthIncrease );
    if ( Vec_PtrSize(vTermsUsed) > 1 )
    {
        pThis0 = (Vta_Obj_t *)Vec_PtrEntry(vTermsUsed, 0);
        pThis1 = (Vta_Obj_t *)Vec_PtrEntryLast(vTermsUsed);
        assert( pThis0->Prio <= pThis1->Prio );
    }
    // assign the priority based on these orders
    Counter = 1;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        pThis->Prio = Counter++;
    Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUnused, pThis, i )
        pThis->Prio = Counter++;
//    Abc_Print( 1, "Used %d  Unused %d\n", Vec_PtrSize(vTermsUsed), Vec_PtrSize(vTermsUnused) );


    // propagate in the direct order
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        assert( pThis->fVisit == 0 );
        assert( pThis->Prio < VTA_LARGE );
        // skip terminal objects
        if ( !pThis->fAdded )
            continue;
        // assumes that values are assigned!!!
        assert( pThis->Value != 0 );
        // propagate
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( pThis->Value == VTA_VAR1 )
            {
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
                pThis->Prio = Abc_MaxInt( pThis0->Prio, pThis1->Prio );
            }
            else if ( pThis->Value == VTA_VAR0 )
            {
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                    pThis->Prio = Abc_MinInt( pThis0->Prio, pThis1->Prio ); // choice!!!
                else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Prio = pThis0->Prio;
                else if ( Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                    pThis->Prio = pThis1->Prio;
                else assert( 0 );
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                pThis->Prio = pThis0->Prio;
            }
            else
                pThis->Prio = 0;
        }
        else if ( Gia_ObjIsConst0(pObj) )
            pThis->Prio = 0;
        else
            assert( 0 );
    }

    // select important values
    pTop = Vta_ManObj( p, Vec_IntEntryLast(vOrder) );
    pTop->fVisit = 1;
    vTermsToAdd = Vec_IntAlloc( 100 );
    Vta_ManForEachObjObjVecReverse( vOrder, p, pThis, pObj, i )
    {
        if ( !pThis->fVisit )
            continue;
        pThis->fVisit = 0;
        assert( pThis->Prio >= 0 && pThis->Prio <= pTop->Prio );
        // skip terminal objects
        if ( !pThis->fAdded )
        {
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) );
            Vec_IntPush( vTermsToAdd, Vta_ObjId(p, pThis) );
            continue;
        }
        // assumes that values are assigned!!!
        assert( pThis->Value != 0 );
        // propagate
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( pThis->Value == VTA_VAR1 )
            {
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
                assert( pThis0->Prio <= pThis->Prio );
                assert( pThis1->Prio <= pThis->Prio );
                pThis0->fVisit = 1;
                pThis1->fVisit = 1;
            }
            else if ( pThis->Value == VTA_VAR0 )
            {
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                {
                    if ( pThis0->fVisit )
                    {
                    }
                    else if ( pThis1->fVisit )
                    {
                    }
                    else if ( pThis0->Prio <= pThis1->Prio ) // choice!!!
                    {
                        pThis0->fVisit = 1;
                        assert( pThis0->Prio == pThis->Prio );
                    }
                    else
                    {
                        pThis1->fVisit = 1;
                        assert( pThis1->Prio == pThis->Prio );
                    }
                }
                else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                {
                    pThis0->fVisit = 1;
                    assert( pThis0->Prio == pThis->Prio );
                }
                else if ( Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                {
                    pThis1->fVisit = 1;
                    assert( pThis1->Prio == pThis->Prio );
                }
                else assert( 0 );
            }
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                pThis0->fVisit = 1;
                assert( pThis0->Prio == pThis->Prio );
            }
        }
        else if ( !Gia_ObjIsConst0(pObj) )
            assert( 0 );
    }

    if ( p->pPars->fAddLayer )
    {
        // mark those currently included
        Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
        {
            assert( pThis->fVisit == 0 );
            pThis->fVisit = 1;
        }
        // add used terms, which have close relationship
        Counter = Vec_IntSize(vTermsToAdd);
        Vec_PtrForEachEntry( Vta_Obj_t *, vTermsUsed, pThis, i )
        {
            if ( pThis->fVisit )
                continue;
    //        Vta_ObjPreds( p, pThis, Gia_ManObj(p->pGia, pThis->iObj), &pThis0, &pThis1 );
    //        if ( (pThis0 && (pThis0->fAdded || pThis0->fVisit)) || (pThis1 && (pThis1->fAdded || pThis1->fVisit)) )
                Vec_IntPush( vTermsToAdd, Vta_ObjId(p, pThis) );
        }
        // remove those currenty included
        Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
            pThis->fVisit = 0;
    }
//    printf( "\n%d -> %d\n", Counter, Vec_IntSize(vTermsToAdd) );
//Vec_IntReverseOrder( vTermsToAdd );
//Vec_IntSort( vTermsToAdd, 1 );


    // cleanup
    Vec_PtrFree( vTermsUsed );
    Vec_PtrFree( vTermsUnused );


    if ( fVerify )
    {
    // verify
    Vta_ManForEachObjVec( vOrder, p, pThis, i )
        pThis->Value = VTA_VARX;
    Vta_ManForEachObjVec( vTermsToAdd, p, pThis, i )
    {
        assert( !pThis->fAdded );
        pThis->Value = sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0;
    }
    // simulate 
    Vta_ManForEachObjObjVec( vOrder, p, pThis, pObj, i )
    {
        assert( pThis->fVisit == 0 );
        if ( !pThis->fAdded )
            continue;
        if ( Gia_ObjIsAnd(pObj) )
        {
            pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame );
            pThis1 = Vga_ManFind( p, Gia_ObjFaninId1p(p->pGia, pObj), pThis->iFrame );
            assert( pThis0 && pThis1 );
            if ( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) )
                pThis->Value = VTA_VAR1;
            else if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) )
                pThis->Value = VTA_VAR0;
            else
                pThis->Value = VTA_VARX;
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( pThis->iFrame > 0 )
            {
                pObj = Gia_ObjRoToRi( p->pGia, pObj );
                pThis0 = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), pThis->iFrame-1 );
                assert( pThis0 );
                if ( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Value = VTA_VAR0;
                else if ( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) )
                    pThis->Value = VTA_VAR1;
                else
                    pThis->Value = VTA_VARX;
            }
            else
            {
                pThis->Value = VTA_VAR0;
            }
        }
        else if ( Gia_ObjIsConst0(pObj) )
        {
            pThis->Value = VTA_VAR0;
        }
        else assert( 0 );
        // double check the solver
        assert( pThis->Value == VTA_VARX || (int)pThis->Value == (sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) ? VTA_VAR1 : VTA_VAR0) );
    }

    // check the output
    if ( !Vta_ValIs1(pTop, Gia_ObjFaninC0(Gia_ManPo(p->pGia, 0))) )
        Abc_Print( 1, "Vta_ManRefineAbstraction(): Terminary simulation verification failed!\n" );
//    else
//        Abc_Print( 1, "Verification OK.\n" );
    }


    // produce true counter-example
    if ( pTop->Prio == 0 )
        pCex = Vga_ManDeriveCex( p );
    else
    {
//       Vta_ManProfileAddition( p, vTermsToAdd );

        Vta_ManForEachObjObjVec( vTermsToAdd, p, pThis, pObj, i )
            if ( !Gia_ObjIsPi(p->pGia, pObj) )
                Vga_ManAddClausesOne( p, pThis->iObj, pThis->iFrame );
        sat_solver2_simplify( p->pSat );
    }
    p->nObjAdded += Vec_IntSize(vTermsToAdd);
    Vec_IntFree( vTermsToAdd );
    return pCex;
}